

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msghash32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  secp256k1_scalar s;
  secp256k1_scalar r;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_sign_cold_5();
  }
  else if ((ctx->ecmult_gen_ctx).built != 0) {
    if (msghash32 == (uchar *)0x0) {
      secp256k1_ecdsa_sign_cold_3();
      return 0;
    }
    if (signature != (secp256k1_ecdsa_signature *)0x0) {
      if (seckey == (uchar *)0x0) {
        secp256k1_ecdsa_sign_cold_1();
        return 0;
      }
      iVar1 = secp256k1_ecdsa_sign_inner(ctx,&r,&s,(int *)0x0,msghash32,seckey,noncefp,noncedata);
      *(uint64_t *)signature->data = r.d[0];
      *(uint64_t *)(signature->data + 8) = r.d[1];
      *(uint64_t *)(signature->data + 0x10) = r.d[2];
      *(uint64_t *)(signature->data + 0x18) = r.d[3];
      *(uint64_t *)(signature->data + 0x20) = s.d[0];
      *(uint64_t *)(signature->data + 0x28) = s.d[1];
      *(uint64_t *)(signature->data + 0x30) = s.d[2];
      *(uint64_t *)(signature->data + 0x38) = s.d[3];
      return iVar1;
    }
    secp256k1_ecdsa_sign_cold_2();
    return 0;
  }
  secp256k1_ecdsa_sign_cold_4();
  return 0;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}